

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandedDecl::getMember
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandedDecl *this,
          StringPtr memberName,Reader subSource)

{
  bool bVar1;
  ResolvedDecl *pRVar2;
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  *other;
  OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
  *pOVar3;
  BrandScope *this_00;
  BrandedDecl local_1e8;
  OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
  *local_140;
  OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter> *r;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_110;
  undefined1 local_a0 [8];
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  _r64;
  BrandedDecl *this_local;
  StringPtr memberName_local;
  
  bVar1 = kj::
          OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
          ::is<capnp::compiler::Resolver::ResolvedParameter>(&this->body);
  if (bVar1) {
    kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__);
  }
  else {
    pRVar2 = kj::
             OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
             ::get<capnp::compiler::Resolver::ResolvedDecl>(&this->body);
    this_local._0_4_ = memberName.content.ptr._0_4_;
    this_local._4_4_ = memberName.content.ptr._4_4_;
    memberName_local.content.ptr._0_4_ = (undefined4)memberName.content.size_;
    memberName_local.content.ptr._4_4_ = memberName.content.size_._4_4_;
    local_128 = this_local._0_4_;
    uStack_124 = this_local._4_4_;
    uStack_120 = memberName_local.content.ptr._0_4_;
    uStack_11c = memberName_local.content.ptr._4_4_;
    (*pRVar2->resolver->_vptr_Resolver[1])
              (&local_110,pRVar2->resolver,memberName.content.ptr,memberName.content.size_);
    other = kj::_::
            readMaybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,capnp::compiler::Resolver::ResolvedParameter>>
                      (&local_110);
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                     *)local_a0,other);
    kj::
    Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::~Maybe(&local_110);
    pOVar3 = kj::_::NullableValue::operator_cast_to_OneOf_((NullableValue *)local_a0);
    if (pOVar3 == (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                   *)0x0) {
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__);
    }
    else {
      local_140 = kj::_::
                  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                  ::operator*((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                               *)local_a0);
      this_00 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->(&this->brand);
      pRVar2 = kj::
               OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
               ::get<capnp::compiler::Resolver::ResolvedDecl>(&this->body);
      BrandScope::interpretResolve(&local_1e8,this_00,pRVar2->resolver,local_140,subSource);
      kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__,&local_1e8);
      ~BrandedDecl(&local_1e8);
    }
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::~NullableValue((NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                      *)local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<BrandedDecl> BrandedDecl::getMember(
    kj::StringPtr memberName, Expression::Reader subSource) {
  if (body.is<Resolver::ResolvedParameter>()) {
    return kj::none;
  } else KJ_IF_SOME(r, body.get<Resolver::ResolvedDecl>().resolver->resolveMember(memberName)) {
    return brand->interpretResolve(*body.get<Resolver::ResolvedDecl>().resolver, r, subSource);
  } else {
    return kj::none;
  }